

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Reader * __thiscall
capnp::ParsedSchema::getSourceInfo(Reader *__return_storage_ptr__,ParsedSchema *this)

{
  NullableValue<capnp::schema::Node::SourceInfo::Reader> *pNVar1;
  Reader *pRVar2;
  Fault local_d8 [3];
  RawBrandedSchema *local_c0;
  Maybe<capnp::schema::Node::SourceInfo::Reader> local_b8;
  undefined1 local_80 [8];
  NullableValue<capnp::schema::Node::SourceInfo::Reader> _kj_result;
  ParsedSchema *this_local;
  
  local_c0 = (this->super_Schema).raw;
  SchemaParser::getSourceInfo(&local_b8,this->parser,(Schema)local_c0);
  pNVar1 = kj::_::readMaybe<capnp::schema::Node::SourceInfo::Reader>(&local_b8);
  kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>::NullableValue
            ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)local_80,pNVar1);
  kj::Maybe<capnp::schema::Node::SourceInfo::Reader>::~Maybe(&local_b8);
  pRVar2 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_80);
  if (pRVar2 != (Reader *)0x0) {
    pNVar1 = kj::mv<kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>>
                       ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)local_80);
    kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>::NullableValue
              ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)
               &_kj_result.field_1.value._reader.nestingLimit,pNVar1);
    kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>::~NullableValue
              ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)local_80);
    pRVar2 = kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>::operator*
                       ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)
                        &_kj_result.field_1.value._reader.nestingLimit);
    memcpy(__return_storage_ptr__,pRVar2,0x30);
    kj::_::NullableValue<capnp::schema::Node::SourceInfo::Reader>::~NullableValue
              ((NullableValue<capnp::schema::Node::SourceInfo::Reader> *)
               &_kj_result.field_1.value._reader.nestingLimit);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x14c,FAILED,"parser->getSourceInfo(*this) != nullptr","");
  kj::_::Debug::Fault::fatal(local_d8);
}

Assistant:

schema::Node::SourceInfo::Reader ParsedSchema::getSourceInfo() const {
  return KJ_ASSERT_NONNULL(parser->getSourceInfo(*this));
}